

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_util_test.cc
# Opt level: O1

void __thiscall
google::protobuf::util::anon_unknown_0::TestUtilTest_TimestampIntegerConversion_Test::TestBody
          (TestUtilTest_TimestampIntegerConversion_Test *this)

{
  Timestamp *timestamp;
  Timestamp *timestamp_00;
  Timestamp *timestamp_01;
  Timestamp *timestamp_02;
  Timestamp *timestamp_03;
  Timestamp *timestamp_04;
  Timestamp *timestamp_05;
  Timestamp *timestamp_06;
  char *pcVar1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_8;
  AssertHelper local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  undefined1 local_60 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  int local_3c;
  Timestamp local_38;
  
  TimeUtil::NanosecondsToTimestamp(&local_38,1);
  TimeUtil::ToString_abi_cxx11_((string *)local_60,(TimeUtil *)&local_38,timestamp);
  testing::internal::CmpHelperEQ<char[31],std::__cxx11::string>
            ((internal *)&local_70,"\"1970-01-01T00:00:00.000000001Z\"",
             "TimeUtil::ToString(TimeUtil::NanosecondsToTimestamp(1))",
             (char (*) [31])"1970-01-01T00:00:00.000000001Z",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_60._1_7_,local_60[0]) != &local_50) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_60._1_7_,local_60[0]),local_50._M_allocated_capacity + 1);
  }
  Timestamp::~Timestamp(&local_38);
  if (local_70.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar1 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0xac,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_60,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_60);
    if (local_38.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*local_38.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  TimeUtil::NanosecondsToTimestamp(&local_38,-1);
  TimeUtil::ToString_abi_cxx11_((string *)local_60,(TimeUtil *)&local_38,timestamp_00);
  testing::internal::CmpHelperEQ<char[31],std::__cxx11::string>
            ((internal *)&local_70,"\"1969-12-31T23:59:59.999999999Z\"",
             "TimeUtil::ToString(TimeUtil::NanosecondsToTimestamp(-1))",
             (char (*) [31])"1969-12-31T23:59:59.999999999Z",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_60._1_7_,local_60[0]) != &local_50) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_60._1_7_,local_60[0]),local_50._M_allocated_capacity + 1);
  }
  Timestamp::~Timestamp(&local_38);
  if (local_70.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar1 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0xae,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_60,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_60);
    if (local_38.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*local_38.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  TimeUtil::MicrosecondsToTimestamp(&local_38,1);
  TimeUtil::ToString_abi_cxx11_((string *)local_60,(TimeUtil *)&local_38,timestamp_01);
  testing::internal::CmpHelperEQ<char[28],std::__cxx11::string>
            ((internal *)&local_70,"\"1970-01-01T00:00:00.000001Z\"",
             "TimeUtil::ToString(TimeUtil::MicrosecondsToTimestamp(1))",
             (char (*) [28])"1970-01-01T00:00:00.000001Z",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_60._1_7_,local_60[0]) != &local_50) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_60._1_7_,local_60[0]),local_50._M_allocated_capacity + 1);
  }
  Timestamp::~Timestamp(&local_38);
  if (local_70.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar1 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0xb0,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_60,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_60);
    if (local_38.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*local_38.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  TimeUtil::MicrosecondsToTimestamp(&local_38,-1);
  TimeUtil::ToString_abi_cxx11_((string *)local_60,(TimeUtil *)&local_38,timestamp_02);
  testing::internal::CmpHelperEQ<char[28],std::__cxx11::string>
            ((internal *)&local_70,"\"1969-12-31T23:59:59.999999Z\"",
             "TimeUtil::ToString(TimeUtil::MicrosecondsToTimestamp(-1))",
             (char (*) [28])"1969-12-31T23:59:59.999999Z",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_60._1_7_,local_60[0]) != &local_50) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_60._1_7_,local_60[0]),local_50._M_allocated_capacity + 1);
  }
  Timestamp::~Timestamp(&local_38);
  if (local_70.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar1 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0xb2,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_60,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_60);
    if (local_38.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*local_38.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  TimeUtil::MillisecondsToTimestamp(&local_38,1);
  TimeUtil::ToString_abi_cxx11_((string *)local_60,(TimeUtil *)&local_38,timestamp_03);
  testing::internal::CmpHelperEQ<char[25],std::__cxx11::string>
            ((internal *)&local_70,"\"1970-01-01T00:00:00.001Z\"",
             "TimeUtil::ToString(TimeUtil::MillisecondsToTimestamp(1))",
             (char (*) [25])"1970-01-01T00:00:00.001Z",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_60._1_7_,local_60[0]) != &local_50) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_60._1_7_,local_60[0]),local_50._M_allocated_capacity + 1);
  }
  Timestamp::~Timestamp(&local_38);
  if (local_70.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar1 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0xb4,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_60,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_60);
    if (local_38.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*local_38.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  TimeUtil::MillisecondsToTimestamp(&local_38,-1);
  TimeUtil::ToString_abi_cxx11_((string *)local_60,(TimeUtil *)&local_38,timestamp_04);
  testing::internal::CmpHelperEQ<char[25],std::__cxx11::string>
            ((internal *)&local_70,"\"1969-12-31T23:59:59.999Z\"",
             "TimeUtil::ToString(TimeUtil::MillisecondsToTimestamp(-1))",
             (char (*) [25])"1969-12-31T23:59:59.999Z",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_60._1_7_,local_60[0]) != &local_50) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_60._1_7_,local_60[0]),local_50._M_allocated_capacity + 1);
  }
  Timestamp::~Timestamp(&local_38);
  if (local_70.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar1 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0xb6,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_60,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_60);
    if (local_38.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*local_38.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  TimeUtil::SecondsToTimestamp(&local_38,1);
  TimeUtil::ToString_abi_cxx11_((string *)local_60,(TimeUtil *)&local_38,timestamp_05);
  testing::internal::CmpHelperEQ<char[21],std::__cxx11::string>
            ((internal *)&local_70,"\"1970-01-01T00:00:01Z\"",
             "TimeUtil::ToString(TimeUtil::SecondsToTimestamp(1))",
             (char (*) [21])"1970-01-01T00:00:01Z",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_60._1_7_,local_60[0]) != &local_50) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_60._1_7_,local_60[0]),local_50._M_allocated_capacity + 1);
  }
  Timestamp::~Timestamp(&local_38);
  if (local_70.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar1 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0xb8,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_60,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_60);
    if (local_38.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*local_38.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  TimeUtil::SecondsToTimestamp(&local_38,-1);
  TimeUtil::ToString_abi_cxx11_((string *)local_60,(TimeUtil *)&local_38,timestamp_06);
  testing::internal::CmpHelperEQ<char[21],std::__cxx11::string>
            ((internal *)&local_70,"\"1969-12-31T23:59:59Z\"",
             "TimeUtil::ToString(TimeUtil::SecondsToTimestamp(-1))",
             (char (*) [21])"1969-12-31T23:59:59Z",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_60._1_7_,local_60[0]) != &local_50) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_60._1_7_,local_60[0]),local_50._M_allocated_capacity + 1);
  }
  Timestamp::~Timestamp(&local_38);
  if (local_70.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar1 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0xba,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_60,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_60);
    if (local_38.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*local_38.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_3c = 1;
  TimeUtil::NanosecondsToTimestamp(&local_38,1);
  local_70.data_ = (AssertHelperData *)TimeUtil::TimestampToNanoseconds(&local_38);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_60,"1",
             "TimeUtil::TimestampToNanoseconds(TimeUtil::NanosecondsToTimestamp(1))",&local_3c,
             (long *)&local_70);
  Timestamp::~Timestamp(&local_38);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar1 = (local_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0xbd,pcVar1);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_38.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*local_38.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  local_3c = -1;
  TimeUtil::NanosecondsToTimestamp(&local_38,-1);
  local_70.data_ = (AssertHelperData *)TimeUtil::TimestampToNanoseconds(&local_38);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_60,"-1",
             "TimeUtil::TimestampToNanoseconds( TimeUtil::NanosecondsToTimestamp(-1))",&local_3c,
             (long *)&local_70);
  Timestamp::~Timestamp(&local_38);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar1 = (local_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0xbf,pcVar1);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_38.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*local_38.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  local_3c = 1;
  TimeUtil::MicrosecondsToTimestamp(&local_38,1);
  local_70.data_ = (AssertHelperData *)TimeUtil::TimestampToMicroseconds(&local_38);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_60,"1",
             "TimeUtil::TimestampToMicroseconds( TimeUtil::MicrosecondsToTimestamp(1))",&local_3c,
             (long *)&local_70);
  Timestamp::~Timestamp(&local_38);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar1 = (local_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0xc1,pcVar1);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_38.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*local_38.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  local_3c = -1;
  TimeUtil::MicrosecondsToTimestamp(&local_38,-1);
  local_70.data_ = (AssertHelperData *)TimeUtil::TimestampToMicroseconds(&local_38);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_60,"-1",
             "TimeUtil::TimestampToMicroseconds( TimeUtil::MicrosecondsToTimestamp(-1))",&local_3c,
             (long *)&local_70);
  Timestamp::~Timestamp(&local_38);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar1 = (local_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0xc3,pcVar1);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_38.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*local_38.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  local_3c = 1;
  TimeUtil::MillisecondsToTimestamp(&local_38,1);
  local_70.data_ = (AssertHelperData *)TimeUtil::TimestampToMilliseconds(&local_38);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_60,"1",
             "TimeUtil::TimestampToMilliseconds( TimeUtil::MillisecondsToTimestamp(1))",&local_3c,
             (long *)&local_70);
  Timestamp::~Timestamp(&local_38);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar1 = (local_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0xc5,pcVar1);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_38.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*local_38.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  local_3c = -1;
  TimeUtil::MillisecondsToTimestamp(&local_38,-1);
  local_70.data_ = (AssertHelperData *)TimeUtil::TimestampToMilliseconds(&local_38);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_60,"-1",
             "TimeUtil::TimestampToMilliseconds( TimeUtil::MillisecondsToTimestamp(-1))",&local_3c,
             (long *)&local_70);
  Timestamp::~Timestamp(&local_38);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar1 = (local_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,199,pcVar1);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_38.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*local_38.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  local_3c = 1;
  TimeUtil::SecondsToTimestamp(&local_38,1);
  local_70.data_ = (AssertHelperData *)TimeUtil::TimestampToSeconds(&local_38);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_60,"1",
             "TimeUtil::TimestampToSeconds(TimeUtil::SecondsToTimestamp(1))",&local_3c,
             (long *)&local_70);
  Timestamp::~Timestamp(&local_38);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar1 = (local_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,200,pcVar1);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_38.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*local_38.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  local_3c = -1;
  TimeUtil::SecondsToTimestamp(&local_38,-1);
  local_70.data_ = (AssertHelperData *)TimeUtil::TimestampToSeconds(&local_38);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_60,"-1",
             "TimeUtil::TimestampToSeconds(TimeUtil::SecondsToTimestamp(-1))",&local_3c,
             (long *)&local_70);
  Timestamp::~Timestamp(&local_38);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar1 = (local_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0xc9,pcVar1);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_38.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*local_38.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  local_3c = 1;
  TimeUtil::NanosecondsToTimestamp(&local_38,1999);
  local_70.data_ = (AssertHelperData *)TimeUtil::TimestampToMicroseconds(&local_38);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_60,"1",
             "TimeUtil::TimestampToMicroseconds( TimeUtil::NanosecondsToTimestamp(1999))",&local_3c,
             (long *)&local_70);
  Timestamp::~Timestamp(&local_38);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar1 = (local_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0xcd,pcVar1);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_38.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*local_38.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  local_3c = -2;
  TimeUtil::NanosecondsToTimestamp(&local_38,-1999);
  local_70.data_ = (AssertHelperData *)TimeUtil::TimestampToMicroseconds(&local_38);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_60,"-2",
             "TimeUtil::TimestampToMicroseconds( TimeUtil::NanosecondsToTimestamp(-1999))",&local_3c
             ,(long *)&local_70);
  Timestamp::~Timestamp(&local_38);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar1 = (local_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0xd3,pcVar1);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_38.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*local_38.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  return;
}

Assistant:

TEST(TestUtilTest, TimestampIntegerConversion) {
  EXPECT_EQ("1970-01-01T00:00:00.000000001Z",
            TimeUtil::ToString(TimeUtil::NanosecondsToTimestamp(1)));
  EXPECT_EQ("1969-12-31T23:59:59.999999999Z",
            TimeUtil::ToString(TimeUtil::NanosecondsToTimestamp(-1)));
  EXPECT_EQ("1970-01-01T00:00:00.000001Z",
            TimeUtil::ToString(TimeUtil::MicrosecondsToTimestamp(1)));
  EXPECT_EQ("1969-12-31T23:59:59.999999Z",
            TimeUtil::ToString(TimeUtil::MicrosecondsToTimestamp(-1)));
  EXPECT_EQ("1970-01-01T00:00:00.001Z",
            TimeUtil::ToString(TimeUtil::MillisecondsToTimestamp(1)));
  EXPECT_EQ("1969-12-31T23:59:59.999Z",
            TimeUtil::ToString(TimeUtil::MillisecondsToTimestamp(-1)));
  EXPECT_EQ("1970-01-01T00:00:01Z",
            TimeUtil::ToString(TimeUtil::SecondsToTimestamp(1)));
  EXPECT_EQ("1969-12-31T23:59:59Z",
            TimeUtil::ToString(TimeUtil::SecondsToTimestamp(-1)));

  EXPECT_EQ(
      1, TimeUtil::TimestampToNanoseconds(TimeUtil::NanosecondsToTimestamp(1)));
  EXPECT_EQ(-1, TimeUtil::TimestampToNanoseconds(
                    TimeUtil::NanosecondsToTimestamp(-1)));
  EXPECT_EQ(1, TimeUtil::TimestampToMicroseconds(
                   TimeUtil::MicrosecondsToTimestamp(1)));
  EXPECT_EQ(-1, TimeUtil::TimestampToMicroseconds(
                    TimeUtil::MicrosecondsToTimestamp(-1)));
  EXPECT_EQ(1, TimeUtil::TimestampToMilliseconds(
                   TimeUtil::MillisecondsToTimestamp(1)));
  EXPECT_EQ(-1, TimeUtil::TimestampToMilliseconds(
                    TimeUtil::MillisecondsToTimestamp(-1)));
  EXPECT_EQ(1, TimeUtil::TimestampToSeconds(TimeUtil::SecondsToTimestamp(1)));
  EXPECT_EQ(-1, TimeUtil::TimestampToSeconds(TimeUtil::SecondsToTimestamp(-1)));

  // Test truncation behavior.
  EXPECT_EQ(1, TimeUtil::TimestampToMicroseconds(
                   TimeUtil::NanosecondsToTimestamp(1999)));
  // For negative values, Timestamp will be rounded down.
  // For example, "1969-12-31T23:59:59.5Z" (i.e., -0.5s) rounded to seconds
  // will be "1969-12-31T23:59:59Z" (i.e., -1s) rather than
  // "1970-01-01T00:00:00Z" (i.e., 0s).
  EXPECT_EQ(-2, TimeUtil::TimestampToMicroseconds(
                    TimeUtil::NanosecondsToTimestamp(-1999)));
}